

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int side2_8d_filter(double *p0,double *p1,double *p2,double *q0,double *q1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  int local_1d0;
  int int_tmp_result_FFWKCAA;
  int r_sign;
  double max4;
  double max3;
  int int_tmp_result;
  int Delta_sign;
  double upper_bound_1;
  double lower_bound_1;
  double max2;
  double max1;
  double eps;
  double r;
  double DeltaLambda1;
  double DeltaLambda0;
  double Delta;
  double a21;
  double a20;
  double a11;
  double q1_7_p0_7;
  double q1_6_p0_6;
  double q1_5_p0_5;
  double q1_4_p0_4;
  double q1_3_p0_3;
  double q1_2_p0_2;
  double q1_1_p0_1;
  double q1_0_p0_0;
  double a10;
  double q0_7_p0_7;
  double q0_6_p0_6;
  double q0_5_p0_5;
  double q0_4_p0_4;
  double q0_3_p0_3;
  double q0_2_p0_2;
  double q0_1_p0_1;
  double q0_0_p0_0;
  double l2;
  double p2_7_p0_7;
  double p2_6_p0_6;
  double p2_5_p0_5;
  double p2_4_p0_4;
  double p2_3_p0_3;
  double p2_2_p0_2;
  double p2_1_p0_1;
  double p2_0_p0_0;
  double l1;
  double p1_7_p0_7;
  double p1_6_p0_6;
  double p1_5_p0_5;
  double p1_4_p0_4;
  double p1_3_p0_3;
  double p1_2_p0_2;
  double p1_1_p0_1;
  double p1_0_p0_0;
  double *q1_local;
  double *q0_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = *p1 - *p0;
  dVar2 = p1[1] - p0[1];
  dVar3 = p1[2] - p0[2];
  dVar4 = p1[3] - p0[3];
  dVar5 = p1[4] - p0[4];
  dVar6 = p1[5] - p0[5];
  dVar7 = p1[6] - p0[6];
  dVar8 = p1[7] - p0[7];
  dVar9 = (dVar8 * dVar8 +
          dVar7 * dVar7 +
          dVar6 * dVar6 +
          dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2) * 1.0;
  dVar10 = *p2 - *p0;
  dVar11 = p2[1] - p0[1];
  dVar12 = p2[2] - p0[2];
  dVar13 = p2[3] - p0[3];
  dVar14 = p2[4] - p0[4];
  dVar15 = p2[5] - p0[5];
  dVar16 = p2[6] - p0[6];
  dVar17 = p2[7] - p0[7];
  dVar18 = *q0 - *p0;
  dVar19 = q0[1] - p0[1];
  dVar20 = q0[2] - p0[2];
  dVar21 = q0[3] - p0[3];
  dVar22 = q0[4] - p0[4];
  dVar23 = q0[5] - p0[5];
  dVar24 = q0[6] - p0[6];
  dVar25 = q0[7] - p0[7];
  dVar26 = (dVar8 * dVar25 +
           dVar7 * dVar24 +
           dVar6 * dVar23 +
           dVar5 * dVar22 + dVar4 * dVar21 + dVar3 * dVar20 + dVar1 * dVar18 + dVar2 * dVar19) * 2.0
  ;
  dVar27 = *q1 - *p0;
  dVar28 = q1[1] - p0[1];
  dVar29 = q1[2] - p0[2];
  dVar30 = q1[3] - p0[3];
  dVar31 = q1[4] - p0[4];
  dVar32 = q1[5] - p0[5];
  dVar33 = q1[6] - p0[6];
  dVar34 = q1[7] - p0[7];
  dVar35 = (dVar8 * dVar34 +
           dVar7 * dVar33 +
           dVar6 * dVar32 +
           dVar5 * dVar31 + dVar4 * dVar30 + dVar3 * dVar29 + dVar1 * dVar27 + dVar2 * dVar28) * 2.0
  ;
  dVar36 = dVar35 - dVar26;
  dVar9 = -((dVar17 * dVar34 +
            dVar16 * dVar33 +
            dVar15 * dVar32 +
            dVar14 * dVar31 + dVar13 * dVar30 + dVar12 * dVar29 + dVar10 * dVar27 + dVar11 * dVar28)
           * 2.0) * (dVar9 - dVar26) +
          dVar36 * (dVar17 * dVar17 +
                   dVar16 * dVar16 +
                   dVar15 * dVar15 +
                   dVar14 * dVar14 +
                   dVar13 * dVar13 + dVar12 * dVar12 + dVar10 * dVar10 + dVar11 * dVar11) * 1.0 +
          -((dVar17 * dVar25 +
            dVar16 * dVar24 +
            dVar15 * dVar23 +
            dVar14 * dVar22 + dVar13 * dVar21 + dVar12 * dVar20 + dVar10 * dVar18 + dVar11 * dVar19)
            * 2.0 * (dVar35 - dVar9));
  max2 = ABS(dVar5);
  if (max2 < ABS(dVar4)) {
    max2 = ABS(dVar4);
  }
  if (max2 < ABS(dVar8)) {
    max2 = ABS(dVar8);
  }
  if (max2 < ABS(dVar1)) {
    max2 = ABS(dVar1);
  }
  if (max2 < ABS(dVar7)) {
    max2 = ABS(dVar7);
  }
  if (max2 < ABS(dVar3)) {
    max2 = ABS(dVar3);
  }
  if (max2 < ABS(dVar2)) {
    max2 = ABS(dVar2);
  }
  if (max2 < ABS(dVar6)) {
    max2 = ABS(dVar6);
  }
  lower_bound_1 = ABS(dVar18);
  if (lower_bound_1 < ABS(dVar19)) {
    lower_bound_1 = ABS(dVar19);
  }
  if (lower_bound_1 < ABS(dVar20)) {
    lower_bound_1 = ABS(dVar20);
  }
  if (lower_bound_1 < ABS(dVar21)) {
    lower_bound_1 = ABS(dVar21);
  }
  if (lower_bound_1 < ABS(dVar22)) {
    lower_bound_1 = ABS(dVar22);
  }
  if (lower_bound_1 < ABS(dVar23)) {
    lower_bound_1 = ABS(dVar23);
  }
  if (lower_bound_1 < ABS(dVar24)) {
    lower_bound_1 = ABS(dVar24);
  }
  if (lower_bound_1 < ABS(dVar25)) {
    lower_bound_1 = ABS(dVar25);
  }
  if (lower_bound_1 < ABS(dVar27)) {
    lower_bound_1 = ABS(dVar27);
  }
  if (lower_bound_1 < ABS(dVar28)) {
    lower_bound_1 = ABS(dVar28);
  }
  if (lower_bound_1 < ABS(dVar29)) {
    lower_bound_1 = ABS(dVar29);
  }
  if (lower_bound_1 < ABS(dVar30)) {
    lower_bound_1 = ABS(dVar30);
  }
  if (lower_bound_1 < ABS(dVar31)) {
    lower_bound_1 = ABS(dVar31);
  }
  if (lower_bound_1 < ABS(dVar32)) {
    lower_bound_1 = ABS(dVar32);
  }
  if (lower_bound_1 < ABS(dVar33)) {
    lower_bound_1 = ABS(dVar33);
  }
  if (lower_bound_1 < ABS(dVar34)) {
    lower_bound_1 = ABS(dVar34);
  }
  upper_bound_1 = lower_bound_1;
  _int_tmp_result = lower_bound_1;
  if (lower_bound_1 <= max2) {
    if (lower_bound_1 < max2) {
      _int_tmp_result = max2;
    }
  }
  else {
    upper_bound_1 = max2;
  }
  if (1.1554293109153009e-147 <= upper_bound_1) {
    if (_int_tmp_result <= 1.8707220957835553e+50) {
      dVar1 = max2 * lower_bound_1 * 1.6667009016668223e-14;
      if (dVar36 <= dVar1) {
        if (-dVar1 <= dVar36) {
          return 0;
        }
        max3._0_4_ = -1;
      }
      else {
        max3._0_4_ = 1;
      }
      max4 = lower_bound_1;
      if (lower_bound_1 < max2) {
        max4 = max2;
      }
      _int_tmp_result_FFWKCAA = lower_bound_1;
      if (lower_bound_1 < ABS(dVar14)) {
        _int_tmp_result_FFWKCAA = ABS(dVar14);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar12)) {
        _int_tmp_result_FFWKCAA = ABS(dVar12);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar10)) {
        _int_tmp_result_FFWKCAA = ABS(dVar10);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar11)) {
        _int_tmp_result_FFWKCAA = ABS(dVar11);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar13)) {
        _int_tmp_result_FFWKCAA = ABS(dVar13);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar15)) {
        _int_tmp_result_FFWKCAA = ABS(dVar15);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar16)) {
        _int_tmp_result_FFWKCAA = ABS(dVar16);
      }
      if (_int_tmp_result_FFWKCAA < ABS(dVar17)) {
        _int_tmp_result_FFWKCAA = ABS(dVar17);
      }
      if (max4 < _int_tmp_result_FFWKCAA) {
        max4 = _int_tmp_result_FFWKCAA;
      }
      upper_bound_1 = max2;
      _int_tmp_result = max2;
      if (max2 <= max4) {
        if (max2 < max4) {
          _int_tmp_result = max4;
        }
      }
      else {
        upper_bound_1 = max4;
      }
      if (_int_tmp_result_FFWKCAA < upper_bound_1) {
        upper_bound_1 = _int_tmp_result_FFWKCAA;
      }
      if (1.2641951066311592e-74 <= upper_bound_1) {
        if (_int_tmp_result <= 1.8707220957835553e+50) {
          dVar1 = max2 * _int_tmp_result_FFWKCAA * _int_tmp_result_FFWKCAA * max4 *
                  8.711401122557855e-13;
          if (dVar9 <= dVar1) {
            if (-dVar1 <= dVar9) {
              return 0;
            }
            local_1d0 = -1;
          }
          else {
            local_1d0 = 1;
          }
          p0_local._4_4_ = max3._0_4_ * local_1d0;
        }
        else {
          p0_local._4_4_ = 0;
        }
      }
      else {
        p0_local._4_4_ = 0;
      }
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int side2_8d_filter( const double* p0, const double* p1, const double* p2, const double* q0, const double* q1) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double Delta;
    Delta = (a11 - a10);
    double DeltaLambda0;
    DeltaLambda0 = (a11 - l1);
    double DeltaLambda1;
    DeltaLambda1 = (l1 - a10);
    double r;
    r = (((Delta * l2) - (a20 * DeltaLambda0)) - (a21 * DeltaLambda1));
    double eps;
    double max1 = fabs(p1_4_p0_4);
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    if( (max1 < fabs(p1_7_p0_7)) )
    {
        max1 = fabs(p1_7_p0_7);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    if( (max1 < fabs(p1_6_p0_6)) )
    {
        max1 = fabs(p1_6_p0_6);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_5_p0_5)) )
    {
        max1 = fabs(p1_5_p0_5);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    if( (max2 < fabs(q0_4_p0_4)) )
    {
        max2 = fabs(q0_4_p0_4);
    } 
    if( (max2 < fabs(q0_5_p0_5)) )
    {
        max2 = fabs(q0_5_p0_5);
    } 
    if( (max2 < fabs(q0_6_p0_6)) )
    {
        max2 = fabs(q0_6_p0_6);
    } 
    if( (max2 < fabs(q0_7_p0_7)) )
    {
        max2 = fabs(q0_7_p0_7);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q1_2_p0_2)) )
    {
        max2 = fabs(q1_2_p0_2);
    } 
    if( (max2 < fabs(q1_3_p0_3)) )
    {
        max2 = fabs(q1_3_p0_3);
    } 
    if( (max2 < fabs(q1_4_p0_4)) )
    {
        max2 = fabs(q1_4_p0_4);
    } 
    if( (max2 < fabs(q1_5_p0_5)) )
    {
        max2 = fabs(q1_5_p0_5);
    } 
    if( (max2 < fabs(q1_6_p0_6)) )
    {
        max2 = fabs(q1_6_p0_6);
    } 
    if( (max2 < fabs(q1_7_p0_7)) )
    {
        max2 = fabs(q1_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (lower_bound_1 < 1.15542931091530087067e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.66670090166682227006e-14 * (max1 * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max3 = max2;
    if( (max3 < max1) )
    {
        max3 = max1;
    } 
    double max4 = max2;
    if( (max4 < fabs(p2_4_p0_4)) )
    {
        max4 = fabs(p2_4_p0_4);
    } 
    if( (max4 < fabs(p2_2_p0_2)) )
    {
        max4 = fabs(p2_2_p0_2);
    } 
    if( (max4 < fabs(p2_0_p0_0)) )
    {
        max4 = fabs(p2_0_p0_0);
    } 
    if( (max4 < fabs(p2_1_p0_1)) )
    {
        max4 = fabs(p2_1_p0_1);
    } 
    if( (max4 < fabs(p2_3_p0_3)) )
    {
        max4 = fabs(p2_3_p0_3);
    } 
    if( (max4 < fabs(p2_5_p0_5)) )
    {
        max4 = fabs(p2_5_p0_5);
    } 
    if( (max4 < fabs(p2_6_p0_6)) )
    {
        max4 = fabs(p2_6_p0_6);
    } 
    if( (max4 < fabs(p2_7_p0_7)) )
    {
        max4 = fabs(p2_7_p0_7);
    } 
    if( (max3 < max4) )
    {
        max3 = max4;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    if( (lower_bound_1 < 1.26419510663115923609e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.87072209578355531992e+50) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (8.71140112255785451890e-13 * (((max1 * max4) * max4) * max3));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}